

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceDefaultInstance
          (FileGenerator *this,int idx,Printer *printer)

{
  Options *options;
  MessageGenerator *this_00;
  long lVar1;
  bool bVar2;
  Options *pOVar3;
  Descriptor *descriptor;
  FieldDescriptor *field;
  long lVar4;
  Descriptor *this_01;
  long lVar5;
  Formatter format;
  string local_d0;
  undefined1 local_b0 [32];
  string local_90;
  FileGenerator *local_70;
  undefined1 local_68 [56];
  
  local_68._0_8_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_68 + 8),&(this->variables_)._M_t);
  pOVar3 = (Options *)
           (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (MessageGenerator *)(&(pOVar3->dllexport_decl)._M_dataplus)[idx]._M_p;
  MessageGenerator::GenerateConstexprConstructor(this_00,printer);
  options = &this->options_;
  DefaultInstanceType_abi_cxx11_(&local_d0,(cpp *)this_00->descriptor_,(Descriptor *)options,pOVar3)
  ;
  pOVar3 = (Options *)&this_00->classname_;
  Formatter::operator()
            ((Formatter *)local_68,
             "struct $1$ {\n  constexpr $1$()\n    : _instance(::$proto_ns$::internal::ConstantInitialized{}) {}\n  ~$1$() {}\n  union {\n    $2$ _instance;\n  };\n};\n"
             ,&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar3)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  DefaultInstanceType_abi_cxx11_(&local_d0,(cpp *)this_00->descriptor_,(Descriptor *)options,pOVar3)
  ;
  DefaultInstanceName_abi_cxx11_
            ((string *)local_b0,(cpp *)this_00->descriptor_,(Descriptor *)options,pOVar3);
  pOVar3 = (Options *)local_b0;
  Formatter::operator()
            ((Formatter *)local_68,"PROTOBUF_ATTRIBUTE_NO_DESTROY PROTOBUF_CONSTINIT $1$ $2$;\n",
             &local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar3);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  this_01 = this_00->descriptor_;
  local_70 = this;
  if (0 < *(int *)(this_01 + 4)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(this_01 + 0x28);
      bVar2 = IsStringInlined((FieldDescriptor *)(lVar1 + lVar5),options);
      if (bVar2) {
        ClassName_abi_cxx11_(&local_d0,(cpp *)this_00->descriptor_,descriptor);
        FieldName_abi_cxx11_((string *)local_b0,(cpp *)(lVar1 + lVar5),field);
        DefaultInstanceName_abi_cxx11_
                  (&local_90,(cpp *)this_00->descriptor_,(Descriptor *)options,pOVar3);
        pOVar3 = (Options *)local_b0;
        Formatter::operator()
                  ((Formatter *)local_68,
                   "PROTOBUF_ATTRIBUTE_INIT_PRIORITY std::true_type $1$::_init_inline_$2$_ = ($3$._instance.$2$_.Init(), std::true_type{});\n"
                   ,&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar3,
                   &local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
          operator_delete((void *)local_b0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
      lVar4 = lVar4 + 1;
      this_01 = this_00->descriptor_;
      lVar5 = lVar5 + 0x48;
    } while (lVar4 < *(int *)(this_01 + 4));
  }
  if ((local_70->options_).lite_implicit_weak_fields != false) {
    DefaultInstanceType_abi_cxx11_(&local_d0,(cpp *)this_01,(Descriptor *)options,pOVar3);
    DefaultInstancePtr_abi_cxx11_
              ((string *)local_b0,(cpp *)this_00->descriptor_,(Descriptor *)options,pOVar3);
    DefaultInstanceName_abi_cxx11_
              (&local_90,(cpp *)this_00->descriptor_,(Descriptor *)options,pOVar3);
    Formatter::operator()
              ((Formatter *)local_68,"$1$* $2$ = &$3$;\n",&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
               &local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_68 + 8));
  return;
}

Assistant:

void FileGenerator::GenerateSourceDefaultInstance(int idx,
                                                  io::Printer* printer) {
  Formatter format(printer, variables_);
  MessageGenerator* generator = message_generators_[idx].get();
  generator->GenerateConstexprConstructor(printer);
  // Use a union to disable the destructor of the _instance member.
  // We can constant initialize, but the object will still have a non-trivial
  // destructor that we need to elide.
  format(
      "struct $1$ {\n"
      "  constexpr $1$()\n"
      "    : _instance(::$proto_ns$::internal::ConstantInitialized{}) {}\n"
      "  ~$1$() {}\n"
      "  union {\n"
      "    $2$ _instance;\n"
      "  };\n"
      "};\n",
      DefaultInstanceType(generator->descriptor_, options_),
      generator->classname_);
  // NO_DESTROY is not necessary for correctness. The empty destructor is
  // enough. However, the empty destructor fails to be elided in some
  // configurations (like non-opt or with certain sanitizers). NO_DESTROY is
  // there just to improve performance and binary size in these builds.
  format("PROTOBUF_ATTRIBUTE_NO_DESTROY PROTOBUF_CONSTINIT $1$ $2$;\n",
         DefaultInstanceType(generator->descriptor_, options_),
         DefaultInstanceName(generator->descriptor_, options_));

  for (int i = 0; i < generator->descriptor_->field_count(); i++) {
    const FieldDescriptor* field = generator->descriptor_->field(i);
    if (IsStringInlined(field, options_)) {
      // Force the initialization of the inlined string in the default instance.
      format(
          "PROTOBUF_ATTRIBUTE_INIT_PRIORITY std::true_type "
          "$1$::_init_inline_$2$_ = "
          "($3$._instance.$2$_.Init(), std::true_type{});\n",
          ClassName(generator->descriptor_), FieldName(field),
          DefaultInstanceName(generator->descriptor_, options_));
    }
  }

  if (options_.lite_implicit_weak_fields) {
    format("$1$* $2$ = &$3$;\n",
           DefaultInstanceType(generator->descriptor_, options_),
           DefaultInstancePtr(generator->descriptor_, options_),
           DefaultInstanceName(generator->descriptor_, options_));
  }
}